

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

void duckdb::MatchAndReplace<std::__cxx11::string>
               (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *original,
               CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *sniffed,string *name,string *error)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (original->set_by_user == true) {
    bVar1 = ::std::operator!=(&original->value,&sniffed->value);
    if (!bVar1) {
      return;
    }
    ::std::operator+(&bStack_108,
                     "CSV Sniffer: Sniffer detected value different than the user input for the ",
                     name);
    ::std::__cxx11::string::append((string *)error);
    ::std::__cxx11::string::~string((string *)&bStack_108);
    ::std::__cxx11::string::string((string *)&local_48,(string *)&original->value);
    ::std::operator+(&local_c8," options \n Set: ",&local_48);
    ::std::operator+(&local_a8,&local_c8,", Sniffed: ");
    ::std::__cxx11::string::string((string *)&local_e8,(string *)&sniffed->value);
    ::std::operator+(&local_88,&local_a8,&local_e8);
    ::std::operator+(&bStack_108,&local_88,anon_var_dwarf_3b2a754 + 8);
    ::std::__cxx11::string::append((string *)error);
    ::std::__cxx11::string::~string((string *)&bStack_108);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    this = &local_48;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_68,(string *)&sniffed->value);
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (original,&local_68,false);
    this = &local_68;
  }
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void MatchAndReplace(CSVOption<T> &original, CSVOption<T> &sniffed, const string &name, string &error) {
	if (original.IsSetByUser()) {
		// We verify that the user input matches the sniffed value
		if (original != sniffed) {
			error += "CSV Sniffer: Sniffer detected value different than the user input for the " + name;
			error += " options \n Set: " + original.FormatValue() + ", Sniffed: " + sniffed.FormatValue() + "\n";
		}
	} else {
		// We replace the value of original with the sniffed value
		original.Set(sniffed.GetValue(), false);
	}
}